

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O1

bool __thiscall Comparator::operator()(Comparator *this,ScheduleHandle *s1,ScheduleHandle *s2)

{
  ulong uVar1;
  uint64_t uVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  pair<unsigned_long,_unsigned_long> pVar16;
  pair<unsigned_long,_unsigned_long> pVar17;
  
  pVar16 = Schedule::analyze((s1->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  pVar17 = Schedule::analyze((s2->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  uVar1 = this->limit;
  bVar5 = pVar17.first <= uVar1;
  if (pVar16.first <= uVar1 == bVar5) {
    if (uVar1 < pVar16.first) {
      pVar16 = Schedule::analyze((s1->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr);
      uVar2 = this->origin_time;
      uVar1 = this->limit;
      lVar3 = pVar16.first - uVar1;
      if (pVar16.first < uVar1 || lVar3 == 0) {
        dVar14 = 0.0;
      }
      else {
        auVar6._8_4_ = (int)((ulong)lVar3 >> 0x20);
        auVar6._0_8_ = lVar3;
        auVar6._12_4_ = 0x45300000;
        auVar7._8_4_ = (int)(uVar1 >> 0x20);
        auVar7._0_8_ = uVar1;
        auVar7._12_4_ = 0x45300000;
        dVar14 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
                 ((auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
      }
      lVar3 = pVar16.second - uVar2;
      auVar8._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar8._0_8_ = lVar3;
      auVar8._12_4_ = 0x45300000;
      auVar9._8_4_ = (int)(uVar2 >> 0x20);
      auVar9._0_8_ = uVar2;
      auVar9._12_4_ = 0x45300000;
      dVar14 = dVar14 * 0.6 +
               (((auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
               ((auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0))) * 0.4;
      pVar16 = Schedule::analyze((s2->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr);
      uVar2 = this->origin_time;
      uVar1 = this->limit;
      lVar3 = pVar16.first - uVar1;
      if (pVar16.first < uVar1 || lVar3 == 0) {
        dVar15 = 0.0;
      }
      else {
        auVar10._8_4_ = (int)((ulong)lVar3 >> 0x20);
        auVar10._0_8_ = lVar3;
        auVar10._12_4_ = 0x45300000;
        auVar11._8_4_ = (int)(uVar1 >> 0x20);
        auVar11._0_8_ = uVar1;
        auVar11._12_4_ = 0x45300000;
        dVar15 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
                 ((auVar11._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
      }
      lVar3 = pVar16.second - uVar2;
      auVar12._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar12._0_8_ = lVar3;
      auVar12._12_4_ = 0x45300000;
      auVar13._8_4_ = (int)(uVar2 >> 0x20);
      auVar13._0_8_ = uVar2;
      auVar13._12_4_ = 0x45300000;
      dVar15 = dVar15 * 0.6 +
               (((auVar12._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
               ((auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0))) * 0.4;
      bVar5 = dVar14 == dVar15;
      bVar4 = dVar14 < dVar15;
    }
    else {
      bVar4 = pVar16.second < pVar17.second;
      bVar5 = pVar16.second == pVar17.second;
    }
    bVar5 = !bVar4 && !bVar5;
  }
  return bVar5;
}

Assistant:

bool operator () (const ScheduleHandle &s1, const ScheduleHandle &s2) const {
        // Whether reaching limit
        size_t s1_peak_memory, s2_peak_memory;
        uint64_t s1_total_time, s2_total_time;
        std::tie(s1_peak_memory, s1_total_time) = s1->analyze();
        std::tie(s2_peak_memory, s2_total_time) = s2->analyze();
        if ((s1_peak_memory <= limit) != (s2_peak_memory <= limit)) {
            return s2_peak_memory <= limit;
        } else if (s1_peak_memory <= limit) {
            return s1_total_time > s2_total_time;
        }

        // Compare both time and memory
        return score(s1) > score(s2);
    }